

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

bool __thiscall
LinearScan::NeedsLoopBackEdgeCompensation
          (LinearScan *this,Lifetime *lifetime,LabelInstr *loopTopLabel)

{
  uint uVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint32 uVar4;
  Loop *pLVar5;
  LabelInstr *loopTopLabel_local;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  if (lifetime == (Lifetime *)0x0) {
    return false;
  }
  bVar2 = StackSym::IsConst(lifetime->sym);
  if (!bVar2) {
    uVar1 = lifetime->start;
    uVar4 = IR::Instr::GetNumber(&loopTopLabel->super_Instr);
    if (uVar1 <= uVar4) {
      pLVar5 = IR::LabelInstr::GetLoop(loopTopLabel);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((pLVar5->regAlloc).liveOnBackEdgeSyms,(lifetime->sym->super_Sym).m_id);
      if ((BVar3 == '\0') ||
         ((uVar4 = IR::Instr::GetNumber(this->currentInstr), lifetime->end <= uVar4 &&
          (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((this->curLoop->regAlloc).symRegUseBv,(lifetime->sym->super_Sym).m_id)
          , BVar3 == '\0')))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    return false;
  }
  return false;
}

Assistant:

bool LinearScan::NeedsLoopBackEdgeCompensation(Lifetime *lifetime, IR::LabelInstr *loopTopLabel)
{
    if (!lifetime)
    {
        return false;
    }

    if (lifetime->sym->IsConst())
    {
        return false;
    }

    // No need if lifetime begins in the loop
    if (lifetime->start > loopTopLabel->GetNumber())
    {
        return false;
    }

    // Only needed if lifetime is live on the back-edge, and the register is used inside the loop, or the lifetime extends
    // beyond the loop (and compensation out of the loop may use this reg)...
    if (!loopTopLabel->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id)
        || (this->currentInstr->GetNumber() >= lifetime->end && !this->curLoop->regAlloc.symRegUseBv->Test(lifetime->sym->m_id)))
    {
        return false;
    }

    return true;
}